

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_header.c
# Opt level: O1

exr_result_t internal_exr_write_header(_internal_exr_context *ctxt)

{
  _internal_exr_part *p_Var1;
  exr_attribute_t *a;
  char *__s1;
  exr_result_t eVar2;
  int iVar3;
  char cVar4;
  long lVar5;
  uint8_t next_byte;
  uint32_t magic_and_version [2];
  undefined1 local_55;
  uint local_54;
  uint64_t *local_50;
  _internal_exr_context *local_48;
  long local_40;
  undefined4 local_38;
  uint local_34;
  
  local_54 = ((uint)(ctxt->has_nonimage_data != '\0') << 0xb |
             (uint)(0x1f < ctxt->max_name_length) << 10 | (uint)(ctxt->is_multipart != '\0') << 0xc)
             + (uint)(ctxt->is_singlepart_tiled != '\0') * 0x200 + 2;
  local_38 = 0x1312f76;
  local_50 = &ctxt->output_file_offset;
  local_34 = local_54;
  eVar2 = (*ctxt->do_write)(ctxt,&local_38,8,local_50);
  if (eVar2 == 0) {
    lVar5 = 0;
    local_48 = ctxt;
    do {
      if (ctxt->num_parts <= lVar5) {
        if (ctxt->is_multipart != '\0') {
          local_55 = 0;
          eVar2 = (*ctxt->do_write)(ctxt,&local_55,1,local_50);
          return eVar2;
        }
        return 0;
      }
      p_Var1 = ctxt->parts[lVar5];
      local_40 = lVar5;
      if (ctxt->legacy_header == '\0') {
        eVar2 = 0;
        if (0 < (p_Var1->attributes).num_attributes) {
          lVar5 = 0;
          do {
            eVar2 = save_attr(ctxt,(p_Var1->attributes).entries[lVar5]);
            if (eVar2 != 0) break;
            lVar5 = lVar5 + 1;
            eVar2 = 0;
          } while (lVar5 < (p_Var1->attributes).num_attributes);
        }
      }
      else if ((p_Var1->attributes).num_attributes < 1) {
        eVar2 = 0;
      }
      else {
        lVar5 = 0;
        eVar2 = 0;
        do {
          a = (p_Var1->attributes).sorted_entries[lVar5];
          if (((local_54 & 0x1800) == 0) && (ctxt->num_parts == 1)) {
            __s1 = a->name;
            iVar3 = strcmp(__s1,"type");
            cVar4 = '\a';
            ctxt = local_48;
            if ((iVar3 != 0) && (iVar3 = strcmp(__s1,"name"), ctxt = local_48, iVar3 != 0))
            goto LAB_0012099e;
          }
          else {
LAB_0012099e:
            eVar2 = save_attr(ctxt,a);
            cVar4 = (eVar2 != 0) * '\x05';
          }
        } while (((cVar4 == '\a') || (cVar4 == '\0')) &&
                (lVar5 = lVar5 + 1, lVar5 < (p_Var1->attributes).num_attributes));
      }
      if (eVar2 == 0) {
        local_55 = 0;
        eVar2 = (*ctxt->do_write)(ctxt,&local_55,1,local_50);
      }
      lVar5 = local_40 + 1;
    } while (eVar2 == 0);
  }
  return eVar2;
}

Assistant:

exr_result_t
internal_exr_write_header (struct _internal_exr_context* ctxt)
{
    exr_result_t rv;
    uint32_t     magic_and_version[2];
    uint32_t     flags;
    uint8_t      next_byte;

    flags = 2; // EXR_VERSION
    if (ctxt->is_multipart) flags |= EXR_MULTI_PART_FLAG;
    if (ctxt->max_name_length > EXR_SHORTNAME_MAXLEN)
        flags |= EXR_LONG_NAMES_FLAG;
    if (ctxt->has_nonimage_data) flags |= EXR_NON_IMAGE_FLAG;
    if (ctxt->is_singlepart_tiled) flags |= EXR_TILED_FLAG;

    magic_and_version[0] = 20000630;
    magic_and_version[1] = flags;

    priv_from_native32 (magic_and_version, 2);

    rv = ctxt->do_write (
        ctxt,
        magic_and_version,
        sizeof (uint32_t) * 2,
        &(ctxt->output_file_offset));
    if (rv != EXR_ERR_SUCCESS) return rv;

    for (int p = 0; rv == EXR_ERR_SUCCESS && p < ctxt->num_parts; ++p)
    {
        struct _internal_exr_part* curp = ctxt->parts[p];
        if (ctxt->legacy_header)
        {
            for (int a = 0; a < curp->attributes.num_attributes; ++a)
            {
                exr_attribute_t *curattr = curp->attributes.sorted_entries[a];
                if (0 == (flags & (EXR_MULTI_PART_FLAG |EXR_NON_IMAGE_FLAG)) &&
                    1 == ctxt->num_parts)
                {
                    if (0 == strcmp (curattr->name, "type") ||
                        0 == strcmp (curattr->name, "name"))
                    {
                        /* old file wouldn't have had this */
                        continue;
                    }
                }
                rv = save_attr (ctxt, curattr);
                if (rv != EXR_ERR_SUCCESS) break;
            }
        }
        else
        {
            for (int a = 0; a < curp->attributes.num_attributes; ++a)
            {
                rv = save_attr (ctxt, curp->attributes.entries[a]);
                if (rv != EXR_ERR_SUCCESS) break;
            }
        }

        /* indicate this part is finished */
        if (rv == EXR_ERR_SUCCESS)
        {
            next_byte = 0;
            rv        = ctxt->do_write (
                ctxt,
                &next_byte,
                sizeof (uint8_t),
                &(ctxt->output_file_offset));
        }
    }

    /* for multipart write a double terminator at the end */
    if (rv == EXR_ERR_SUCCESS && ctxt->is_multipart)
    {
        next_byte = 0;
        rv        = ctxt->do_write (
            ctxt, &next_byte, sizeof (uint8_t), &(ctxt->output_file_offset));
    }

    return rv;
}